

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O0

bool ON_BrepConeLoop(ON_Brep *brep,int loop_index,ON_3dPoint apex_point)

{
  bool *pbVar1;
  int i_00;
  int iVar2;
  int iVar3;
  int iVar4;
  ON_BrepLoop *pOVar5;
  int *piVar6;
  ON_BrepTrim *pOVar7;
  ON_BrepEdge *edge;
  ON_BrepFace *pOVar8;
  ON_BrepFace *side_face;
  ON_BrepTrim *first_face_east_trim;
  ON_BrepTrim *prev_west_trim;
  ON_BrepEdge *base_edge;
  ON_BrepTrim *trim;
  ON_NurbsSurface *cone_srf;
  ON_BrepVertex *apex_vertex;
  int first_face_east_trim_index;
  int prev_face_index;
  int edge_count0;
  int trim_count0;
  int loop_trim_count;
  bool bRev3d [4];
  int eid [4];
  int vid [4];
  int i;
  int ti;
  int lti;
  int loop_index_local;
  ON_Brep *brep_local;
  
  if ((loop_index < 0) &&
     (iVar2 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&brep->m_L),
     iVar2 <= loop_index)) {
    brep_local._7_1_ = false;
  }
  else {
    pOVar5 = ON_ClassArray<ON_BrepLoop>::operator[]
                       ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,loop_index);
    iVar2 = ON_SimpleArray<int>::Count(&pOVar5->m_ti);
    if (iVar2 == 0) {
      brep_local._7_1_ = false;
    }
    else {
      iVar3 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&brep->m_T);
      iVar4 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&brep->m_E);
      ON_BrepExtrudeHelper_ReserveSpace(brep,iVar2,0);
      apex_vertex._4_4_ = -1;
      apex_vertex._0_4_ = -1;
      ON_Brep::NewVertex(brep,apex_point,0.0);
      for (i = 0; i < iVar2; i = i + 1) {
        trim = (ON_BrepTrim *)0x0;
        pOVar5 = ON_ClassArray<ON_BrepLoop>::operator[]
                           ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,loop_index);
        piVar6 = ON_SimpleArray<int>::operator[](&pOVar5->m_ti,i);
        i_00 = *piVar6;
        if ((-1 < i_00) && (i_00 < iVar3)) {
          for (vid[2] = 0; vid[2] < 4; vid[2] = vid[2] + 1) {
            eid[(long)vid[2] + 2] = -1;
            pbVar1 = bRev3d + (long)vid[2] * 4 + -4;
            pbVar1[0] = true;
            pbVar1[1] = true;
            pbVar1[2] = true;
            pbVar1[3] = true;
          }
          trim_count0._0_1_ = 0;
          trim_count0._1_1_ = 0;
          trim_count0._2_1_ = 0;
          trim_count0._3_1_ = 0;
          pOVar7 = ON_ClassArray<ON_BrepTrim>::operator[]
                             ((ON_ClassArray<ON_BrepTrim> *)&brep->m_T,i_00);
          if ((-1 < pOVar7->m_ei) && (pOVar7->m_ei < iVar4)) {
            edge = ON_ClassArray<ON_BrepEdge>::operator[]
                             ((ON_ClassArray<ON_BrepEdge> *)&brep->m_E,pOVar7->m_ei);
            eid[2] = pOVar7->m_vi[1];
            eid[3] = pOVar7->m_vi[0];
            loop_trim_count = edge->m_edge_index;
            trim_count0._0_1_ = (pOVar7->m_bRev3d & 1U) - 1 & 1;
            trim = (ON_BrepTrim *)
                   ON_BrepExtrudeHelper_MakeConeSrf(&apex_point,edge,(bool)(undefined1)trim_count0);
          }
          if (trim != (ON_BrepTrim *)0x0) {
            if (-1 < apex_vertex._4_4_) {
              pOVar8 = ON_ClassArray<ON_BrepFace>::operator[]
                                 ((ON_ClassArray<ON_BrepFace> *)&brep->m_F,apex_vertex._4_4_);
              piVar6 = ON_SimpleArray<int>::operator[](&pOVar8->m_li,0);
              pOVar5 = ON_ClassArray<ON_BrepLoop>::operator[]
                                 ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,*piVar6);
              piVar6 = ON_SimpleArray<int>::operator[](&pOVar5->m_ti,3);
              pOVar7 = ON_ClassArray<ON_BrepTrim>::operator[]
                                 ((ON_ClassArray<ON_BrepTrim> *)&brep->m_T,*piVar6);
              bRev3d = (bool  [4])pOVar7->m_ei;
              trim_count0._1_1_ = (pOVar7->m_bRev3d & 1U) - 1 & 1;
            }
            if ((-1 < (int)apex_vertex) &&
               (pOVar7 = ON_ClassArray<ON_BrepTrim>::operator[]
                                   ((ON_ClassArray<ON_BrepTrim> *)&brep->m_T,(int)apex_vertex),
               pOVar7->m_vi[0] == eid[2])) {
              pOVar7 = ON_ClassArray<ON_BrepTrim>::operator[]
                                 ((ON_ClassArray<ON_BrepTrim> *)&brep->m_T,(int)apex_vertex);
              eid[1] = pOVar7->m_ei;
              trim_count0._3_1_ = (pOVar7->m_bRev3d & 1U) - 1 & 1;
            }
            pOVar8 = ON_Brep::NewFace(brep,(ON_Surface *)trim,eid + 2,&loop_trim_count,
                                      (bool *)&trim_count0);
            if ((pOVar8 != (ON_BrepFace *)0x0) &&
               (apex_vertex._4_4_ = pOVar8->m_face_index, (int)apex_vertex < 0)) {
              piVar6 = ON_SimpleArray<int>::operator[](&pOVar8->m_li,0);
              pOVar5 = ON_ClassArray<ON_BrepLoop>::operator[]
                                 ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,*piVar6);
              piVar6 = ON_SimpleArray<int>::operator[](&pOVar5->m_ti,1);
              apex_vertex._0_4_ = *piVar6;
            }
          }
        }
      }
      brep_local._7_1_ = true;
    }
  }
  return brep_local._7_1_;
}

Assistant:

bool ON_BrepConeLoop( 
          ON_Brep& brep,
          int loop_index,
          ON_3dPoint apex_point
          )
{
  if ( loop_index < 0 && loop_index >= brep.m_L.Count() )
    return false;

  int lti, ti, i, vid[4], eid[4];
  bool bRev3d[4];

  // indices of new faces appended to the side_face_index[] array 
  // (1 face index for each trim, -1 is used for singular trims)

  // count number of new objects so we can grow arrays
  // efficiently and use refs to dynamic array elements.
  const int loop_trim_count = brep.m_L[loop_index].m_ti.Count();
  if ( loop_trim_count == 0 )
    return false;

  // save input trim and edge counts for use below
  const int trim_count0 = brep.m_T.Count();
  const int edge_count0 = brep.m_E.Count();

  ON_BrepExtrudeHelper_ReserveSpace( brep, loop_trim_count, 0 );

  int prev_face_index = -1;
  int first_face_east_trim_index = -1;

  ON_BrepVertex& apex_vertex = brep.NewVertex( apex_point, 0.0 );

  for ( lti = 0; lti < loop_trim_count; lti++ )
  {
    ON_NurbsSurface* cone_srf = 0;
    ti = brep.m_L[loop_index].m_ti[lti];
    if ( ti < 0 || ti >= trim_count0 )
      continue;

    for ( i = 0; i < 4; i++ )
    {
      vid[i] = -1;
      eid[i] = -1;
    }
    bRev3d[0] = false;
    bRev3d[1] = false;
    bRev3d[2] = false;
    bRev3d[3] = false;

    // get side surface for new face
    // get side surface for new face
    {
      ON_BrepTrim& trim = brep.m_T[ti];
      if ( trim.m_ei >= 0 &&  trim.m_ei < edge_count0 )
      {
        const ON_BrepEdge& base_edge = brep.m_E[trim.m_ei];

        // connect new face to existing topology on trim
        vid[0] = trim.m_vi[1];
        vid[1] = trim.m_vi[0];
        eid[0] = base_edge.m_edge_index;
        bRev3d[0] = (trim.m_bRev3d?false:true);
        cone_srf = ON_BrepExtrudeHelper_MakeConeSrf( apex_point, base_edge, bRev3d[0] );
      }
    }
    if ( !cone_srf )
      continue;
    vid[2] = apex_vertex.m_vertex_index;
    vid[3] = apex_vertex.m_vertex_index;

    if ( prev_face_index >= 0 )
    {
      const ON_BrepTrim& prev_west_trim = brep.m_T[ brep.m_L[ brep.m_F[prev_face_index].m_li[0]].m_ti[3] ];
      vid[2] = prev_west_trim.m_vi[0];
      eid[1] = prev_west_trim.m_ei;
      bRev3d[1] = (prev_west_trim.m_bRev3d?false:true);
    }
    if ( first_face_east_trim_index >= 0 && brep.m_T[first_face_east_trim_index].m_vi[0] == vid[0] )
    {
      const ON_BrepTrim& first_face_east_trim = brep.m_T[first_face_east_trim_index];
      vid[3] = first_face_east_trim.m_vi[1];
      eid[3] = first_face_east_trim.m_ei;
      bRev3d[3] = (first_face_east_trim.m_bRev3d?false:true);
    }
    const ON_BrepFace* side_face = brep.NewFace(cone_srf,vid,eid,bRev3d);
    if ( side_face )
    {
      prev_face_index = side_face->m_face_index;
      if ( first_face_east_trim_index < 0 )
        first_face_east_trim_index = brep.m_L[ side_face->m_li[0] ].m_ti[1];
    }
  }

  return true;
}